

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typechecking.cc
# Opt level: O1

void __thiscall
tchecker::details::statement_typechecker_t::visit
          (statement_typechecker_t *this,local_array_statement_t *stmt)

{
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *__x;
  element_type *peVar1;
  pointer pcVar2;
  expression_t *expr;
  integer_variables_t *piVar3;
  clock_variables_t *pcVar4;
  long lVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  undefined8 uVar6;
  undefined8 uVar7;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_01;
  bool bVar8;
  integer_t iVar9;
  long *plVar10;
  pointer ppVar11;
  shared_ptr<const_tchecker::typed_var_expression_t> variable;
  statement_type_t stmt_type;
  integer_t size;
  shared_ptr<const_tchecker::typed_expression_t> szexpr;
  string name;
  undefined1 local_108 [43];
  undefined1 local_dd;
  statement_type_t local_dc;
  undefined1 local_d8 [40];
  shared_ptr<const_tchecker::typed_expression_t> local_b0;
  expression_type_t local_9c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  integer_variables_t *local_78;
  _Any_data local_70;
  code *local_60;
  _Any_data local_50;
  code *local_40;
  
  local_dc = STMT_TYPE_BAD;
  peVar1 = (stmt->_variable).
           super___shared_ptr<const_tchecker::var_expression_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  pcVar2 = (peVar1->_name)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_98,pcVar2,pcVar2 + (peVar1->_name)._M_string_length);
  expr = (stmt->_size).super___shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>.
         _M_ptr;
  piVar3 = this->_intvars;
  pcVar4 = this->_clocks;
  __x = &this->_error;
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::function((function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              *)&local_50,__x);
  local_78 = &this->_localvars;
  typecheck((tchecker *)local_108,expr,local_78,piVar3,pcVar4,
            (function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
             *)&local_50);
  local_b0.super___shared_ptr<const_tchecker::typed_expression_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)local_108._0_8_;
  local_b0.super___shared_ptr<const_tchecker::typed_expression_t,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_108._8_8_;
  local_108._0_8_ = (pointer)0x0;
  local_108._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (local_40 != (code *)0x0) {
    (*local_40)(&local_50,&local_50,__destroy_functor);
  }
  bVar8 = integer_valued((expression_type_t)
                         ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &(local_b0.
                           super___shared_ptr<const_tchecker::typed_expression_t,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr)->field_0x0)->_M_string_length);
  if (bVar8) {
    boost::container::dtl::
    flat_tree<boost::container::dtl::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_boost::container::dtl::select1st<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::container::new_allocator<boost::container::dtl::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
    ::find((flat_tree<boost::container::dtl::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_boost::container::dtl::select1st<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::container::new_allocator<boost::container::dtl::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
            *)local_108,
           (key_type *)
           &(this->_localvars).
            super_array_variables_t<unsigned_int,_tchecker::intvar_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super_size_variables_t<unsigned_int,_tchecker::intvar_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super_variables_t<unsigned_int,_tchecker::intvar_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._index._value_map);
    if ((pointer)local_108._0_8_ ==
        (this->_localvars).
        super_array_variables_t<unsigned_int,_tchecker::intvar_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super_size_variables_t<unsigned_int,_tchecker::intvar_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super_variables_t<unsigned_int,_tchecker::intvar_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._index._value_map.m_flat_tree.m_data.m_seq.m_holder.m_start +
        *(stored_size_type *)
         ((long)&(this->_localvars).
                 super_array_variables_t<unsigned_int,_tchecker::intvar_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super_size_variables_t<unsigned_int,_tchecker::intvar_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super_variables_t<unsigned_int,_tchecker::intvar_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._index._value_map.m_flat_tree + 8)) {
      piVar3 = this->_intvars;
      boost::container::dtl::
      flat_tree<boost::container::dtl::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_boost::container::dtl::select1st<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::container::new_allocator<boost::container::dtl::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
      ::find((flat_tree<boost::container::dtl::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_boost::container::dtl::select1st<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::container::new_allocator<boost::container::dtl::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
              *)local_108,
             (key_type *)
             &(piVar3->
              super_array_variables_t<unsigned_int,_tchecker::intvar_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ).
              super_size_variables_t<unsigned_int,_tchecker::intvar_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super_variables_t<unsigned_int,_tchecker::intvar_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._index._value_map);
      if ((pointer)local_108._0_8_ ==
          (piVar3->
          super_array_variables_t<unsigned_int,_tchecker::intvar_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ).
          super_size_variables_t<unsigned_int,_tchecker::intvar_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super_variables_t<unsigned_int,_tchecker::intvar_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._index._value_map.m_flat_tree.m_data.m_seq.m_holder.m_start +
          *(stored_size_type *)
           ((long)&(piVar3->
                   super_array_variables_t<unsigned_int,_tchecker::intvar_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ).
                   super_size_variables_t<unsigned_int,_tchecker::intvar_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super_variables_t<unsigned_int,_tchecker::intvar_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._index._value_map.m_flat_tree.m_data + 8)) {
        iVar9 = const_evaluate((stmt->_size).
                               super___shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr);
        local_d8._0_4_ = iVar9;
        local_dc = STMT_TYPE_LOCAL_ARRAY;
        local_9c = EXPR_TYPE_INTTERM;
        local_108._0_8_ = (pointer)0x0;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<tchecker::typed_int_expression_t,std::allocator<tchecker::typed_int_expression_t>,tchecker::expression_type_t,int&>
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_108 + 8),
                   (typed_int_expression_t **)local_108,
                   (allocator<tchecker::typed_int_expression_t> *)&local_dd,&local_9c,
                   (int *)local_d8);
        this_01._M_pi =
             local_b0.
             super___shared_ptr<const_tchecker::typed_expression_t,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
        local_b0.super___shared_ptr<const_tchecker::typed_expression_t,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_108._8_8_;
        local_b0.super___shared_ptr<const_tchecker::typed_expression_t,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = (element_type *)local_108._0_8_;
        local_108._0_8_ = (pointer)0x0;
        local_108._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        if (this_01._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01._M_pi);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_108._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_108._8_8_);
        }
        integer_variables_t::declare(local_78,&local_98,local_d8._0_4_,-0x80000000,0x7fffffff,0);
        goto LAB_001d0ebc;
      }
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108,
                     "local variable already exists as a global one: ",&local_98);
      if ((this->_error).super__Function_base._M_manager == (_Manager_type)0x0) {
        std::__throw_bad_function_call();
      }
      (*(this->_error)._M_invoker)
                ((_Any_data *)__x,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108);
    }
    else {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108,
                     "local variable already exists: ",&local_98);
      if ((this->_error).super__Function_base._M_manager == (_Manager_type)0x0) {
        std::__throw_bad_function_call();
      }
      (*(this->_error)._M_invoker)
                ((_Any_data *)__x,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108);
    }
    local_d8._16_8_ = local_108._16_8_;
    ppVar11 = (pointer)local_108._0_8_;
    if ((pointer)local_108._0_8_ == (pointer)(local_108 + 0x10)) goto LAB_001d0ebc;
  }
  else {
    expression_t::to_string_abi_cxx11_
              ((string *)local_d8,
               (expression_t *)
               ((long)&(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &(local_b0.
                          super___shared_ptr<const_tchecker::typed_expression_t,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr)->field_0x0)->_M_dataplus)._M_p +
               *(long *)((((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &(local_b0.
                            super___shared_ptr<const_tchecker::typed_expression_t,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr)->field_0x0)->_M_dataplus)._M_p + -0x38)));
    plVar10 = (long *)std::__cxx11::string::replace((ulong)local_d8,0,(char *)0x0,0x21751c);
    ppVar11 = (pointer)(plVar10 + 2);
    if ((pointer)*plVar10 == ppVar11) {
      local_108._16_8_ = (ppVar11->first)._M_dataplus._M_p;
      local_108._24_4_ = (undefined4)plVar10[3];
      local_108._28_4_ = *(undefined4 *)((long)plVar10 + 0x1c);
      local_108._0_8_ = (pointer)(local_108 + 0x10);
    }
    else {
      local_108._16_8_ = (ppVar11->first)._M_dataplus._M_p;
      local_108._0_8_ = (pointer)*plVar10;
    }
    local_108._8_8_ = plVar10[1];
    *plVar10 = (long)ppVar11;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    if ((this->_error).super__Function_base._M_manager == (_Manager_type)0x0) {
      std::__throw_bad_function_call();
    }
    (*(this->_error)._M_invoker)
              ((_Any_data *)__x,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108);
    if ((pointer)local_108._0_8_ != (pointer)(local_108 + 0x10)) {
      operator_delete((void *)local_108._0_8_,(ulong)(local_108._16_8_ + 1));
    }
    ppVar11 = (pointer)local_d8._0_8_;
    if ((pointer)local_d8._0_8_ == (pointer)(local_d8 + 0x10)) goto LAB_001d0ebc;
  }
  operator_delete(ppVar11,(ulong)(local_d8._16_8_ + 1));
LAB_001d0ebc:
  peVar1 = (stmt->_variable).
           super___shared_ptr<const_tchecker::var_expression_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  lVar5 = *(long *)(*(long *)peVar1 + -0x38);
  piVar3 = this->_intvars;
  pcVar4 = this->_clocks;
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::function((function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              *)&local_70,__x);
  typecheck((tchecker *)local_d8,(expression_t *)((long)&peVar1->field_0x0 + lVar5),local_78,piVar3,
            pcVar4,(function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                    *)&local_70);
  if ((pointer)local_d8._0_8_ == (pointer)0x0) {
    local_108._0_8_ = (pointer)0x0;
  }
  else {
    local_108._0_8_ =
         __dynamic_cast(local_d8._0_8_,&typed_expression_t::typeinfo,
                        &typed_var_expression_t::typeinfo,0);
  }
  if ((pointer)local_108._0_8_ == (pointer)0x0) {
    local_108._0_8_ = (pointer)0x0;
    local_108._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  else {
    local_108._8_8_ = local_d8._8_8_;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(_Atomic_word *)(local_d8._8_8_ + 8) = *(_Atomic_word *)(local_d8._8_8_ + 8) + 1;
        UNLOCK();
      }
      else {
        *(_Atomic_word *)(local_d8._8_8_ + 8) = *(_Atomic_word *)(local_d8._8_8_ + 8) + 1;
      }
    }
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_);
  }
  if (local_60 != (code *)0x0) {
    (*local_60)(&local_70,&local_70,__destroy_functor);
  }
  local_d8._0_8_ = (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<tchecker::typed_local_array_statement_t,std::allocator<tchecker::typed_local_array_statement_t>,tchecker::statement_type_t&,std::shared_ptr<tchecker::typed_var_expression_t_const>&,std::shared_ptr<tchecker::typed_expression_t_const>&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_d8 + 8),
             (typed_local_array_statement_t **)local_d8,
             (allocator<tchecker::typed_local_array_statement_t> *)&local_9c,&local_dc,
             (shared_ptr<const_tchecker::typed_var_expression_t> *)local_108,&local_b0);
  uVar7 = local_d8._8_8_;
  uVar6 = local_d8._0_8_;
  local_d8._0_8_ = (pointer)0x0;
  local_d8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this_00 = (this->_typed_stmt).
            super___shared_ptr<tchecker::typed_statement_t,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi;
  (this->_typed_stmt).super___shared_ptr<tchecker::typed_statement_t,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)uVar6;
  (this->_typed_stmt).super___shared_ptr<tchecker::typed_statement_t,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar7;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_108._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_108._8_8_);
  }
  if (local_b0.super___shared_ptr<const_tchecker::typed_expression_t,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_b0.
               super___shared_ptr<const_tchecker::typed_expression_t,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

virtual void visit(tchecker::local_array_statement_t const & stmt)
  {
    enum tchecker::statement_type_t stmt_type = tchecker::STMT_TYPE_BAD;

    std::string name = stmt.variable().name();
    std::shared_ptr<tchecker::typed_expression_t const> szexpr{
        tchecker::typecheck(stmt.size(), _localvars, _intvars, _clocks, _error)};

    if (!integer_valued(szexpr->type())) {
      _error("array size is not an integer: " + szexpr->to_string());
    }
    else if (_localvars.is_variable(name)) {
      _error("local variable already exists: " + name);
    }
    else if (_intvars.is_variable(name)) {
      _error("local variable already exists as a global one: " + name);
    }
    else {
      try {
        auto size = tchecker::const_evaluate(stmt.size());
        stmt_type = tchecker::STMT_TYPE_LOCAL_ARRAY;
        szexpr = std::make_shared<tchecker::typed_int_expression_t>(EXPR_TYPE_INTTERM, size);
        _localvars.declare(name, size, tchecker::int_minval, tchecker::int_maxval, 0);
      }
      catch (...) {
        _error("can't compute array size:" + stmt.to_string());
      }
    }
    auto variable = std::dynamic_pointer_cast<tchecker::typed_var_expression_t const>(
        tchecker::typecheck(stmt.variable(), _localvars, _intvars, _clocks, _error));
    _typed_stmt = std::make_shared<tchecker::typed_local_array_statement_t>(stmt_type, variable, szexpr);
  }